

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

_Bool run_container_is_subset_array(run_container_t *container1,array_container_t *container2)

{
  ushort min;
  int iVar1;
  uint uVar2;
  uint uVar3;
  int32_t iVar4;
  int32_t stop;
  int32_t start;
  int i;
  int32_t stop_pos;
  int32_t start_pos;
  array_container_t *container2_local;
  run_container_t *container1_local;
  
  iVar1 = run_container_cardinality(container1);
  if (container2->cardinality < iVar1) {
    container1_local._7_1_ = false;
  }
  else {
    start = -1;
    for (stop = 0; stop < container1->n_runs; stop = stop + 1) {
      min = container1->runs[stop].value;
      uVar2 = (uint)min;
      uVar3 = uVar2 + container1->runs[stop].length;
      iVar4 = advanceUntil(container2->array,start,container2->cardinality,min);
      start = advanceUntil(container2->array,start,container2->cardinality,(uint16_t)uVar3);
      if (iVar4 == container2->cardinality) {
        return false;
      }
      if (((start - iVar4 != uVar3 - uVar2) || (container2->array[iVar4] != uVar2)) ||
         (container2->array[start] != uVar3)) {
        return false;
      }
    }
    container1_local._7_1_ = true;
  }
  return container1_local._7_1_;
}

Assistant:

bool run_container_is_subset_array(const run_container_t* container1,
                                   const array_container_t* container2) {
    if (run_container_cardinality(container1) > container2->cardinality)
        return false;
    int32_t start_pos = -1, stop_pos = -1;
    for (int i = 0; i < container1->n_runs; ++i) {
        int32_t start = container1->runs[i].value;
        int32_t stop = start + container1->runs[i].length;
        start_pos = advanceUntil(container2->array, stop_pos,
                                 container2->cardinality, start);
        stop_pos = advanceUntil(container2->array, stop_pos,
                                container2->cardinality, stop);
        if (start_pos == container2->cardinality) {
            return false;
        } else if (stop_pos - start_pos != stop - start ||
                   container2->array[start_pos] != start ||
                   container2->array[stop_pos] != stop) {
            return false;
        }
    }
    return true;
}